

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O2

bool __thiscall
ctemplate::TemplateCache::ResolveTemplateFilename
          (TemplateCache *this,string *unresolved,string *resolved,FileStat *statbuf)

{
  Mutex *this_00;
  bool bVar1;
  bool bVar2;
  string *a;
  string local_50;
  
  this_00 = this->search_path_mutex_;
  Mutex::ReaderLock(this_00);
  if ((this->search_path_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->search_path_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar1 = IsAbspath(unresolved);
    if (!bVar1) {
      a = (this->search_path_).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
      do {
        if (a == (this->search_path_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00126d4f;
        PathJoin(&local_50,a,unresolved);
        std::__cxx11::string::operator=((string *)resolved,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        bVar1 = File::Stat(resolved,statbuf);
        a = a + 1;
      } while (!bVar1);
      bVar1 = true;
      goto LAB_00126da3;
    }
  }
  std::__cxx11::string::_M_assign((string *)resolved);
  bVar2 = File::Stat(resolved,statbuf);
  bVar1 = true;
  if (!bVar2) {
LAB_00126d4f:
    resolved->_M_string_length = 0;
    *(resolved->_M_dataplus)._M_p = '\0';
    bVar1 = false;
  }
LAB_00126da3:
  Mutex::ReaderUnlock(this_00);
  return bVar1;
}

Assistant:

bool TemplateCache::ResolveTemplateFilename(const string& unresolved,
                                            string* resolved,
                                            FileStat* statbuf) const {
  ReaderMutexLock ml(search_path_mutex_);
  if (search_path_.empty() || IsAbspath(unresolved)) {
    *resolved = unresolved;
    if (File::Stat(*resolved, statbuf)) {
      VLOG(1) << "Resolved " << unresolved << " to " << *resolved << endl;
      return true;
    }
  } else {
    for (TemplateSearchPath::const_iterator path = search_path_.begin();
         path != search_path_.end();
         ++path) {
      *resolved = PathJoin(*path, unresolved);
      if (File::Stat(*resolved, statbuf)) {
        VLOG(1) << "Resolved " << unresolved << " to " << *resolved << endl;
        return true;
      }
    }
  }

  resolved->clear();
  return false;
}